

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SkipBitUi32s(CSzData *sd,UInt32 numItems)

{
  Byte *pBVar1;
  SRes SVar2;
  ulong uVar3;
  byte *pbVar4;
  uint uVar5;
  UInt32 numDefined;
  ulong uVar6;
  UInt32 UVar7;
  byte bVar8;
  byte *pbVar9;
  bool bVar10;
  
  SVar2 = 0x10;
  if (sd->Size != 0) {
    uVar3 = sd->Size - 1;
    sd->Size = uVar3;
    pBVar1 = sd->Data;
    pbVar4 = pBVar1 + 1;
    sd->Data = pbVar4;
    UVar7 = numItems;
    if (*pBVar1 == '\0') {
      uVar6 = (ulong)(numItems + 7 >> 3);
      bVar10 = uVar3 < uVar6;
      uVar3 = uVar3 - uVar6;
      if (bVar10) {
        return 0x10;
      }
      UVar7 = 0;
      if (numItems != 0) {
        uVar5 = 0;
        bVar8 = 0;
        pbVar9 = pbVar4;
        do {
          if (uVar5 == 0) {
            bVar8 = *pbVar9;
            pbVar9 = pbVar9 + 1;
            uVar5 = 8;
          }
          uVar5 = uVar5 - 1;
          UVar7 = UVar7 + ((bVar8 >> (uVar5 & 0x1f) & 1) != 0);
          numItems = numItems - 1;
        } while (numItems != 0);
      }
      sd->Size = uVar3;
      pbVar4 = pbVar4 + uVar6;
      sd->Data = pbVar4;
    }
    uVar6 = (ulong)UVar7;
    if (uVar6 <= uVar3 >> 2) {
      sd->Size = uVar3 + uVar6 * -4;
      sd->Data = pbVar4 + uVar6 * 4;
      SVar2 = 0;
    }
  }
  return SVar2;
}

Assistant:

static SRes SkipBitUi32s(CSzData *sd, UInt32 numItems)
{
  Byte allAreDefined;
  UInt32 numDefined = numItems;
  SZ_READ_BYTE(allAreDefined);
  if (!allAreDefined)
  {
    size_t numBytes = (numItems + 7) >> 3;
    if (numBytes > sd->Size)
      return SZ_ERROR_ARCHIVE;
    numDefined = CountDefinedBits(sd->Data, numItems);
    SKIP_DATA(sd, numBytes);
  }
  if (numDefined > (sd->Size >> 2))
    return SZ_ERROR_ARCHIVE;
  SKIP_DATA(sd, (size_t)numDefined * 4);
  return SZ_OK;
}